

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tank.cpp
# Opt level: O2

void __thiscall Tank::validate(Tank *this,Network *nw)

{
  Curve *pCVar1;
  NetworkError *pNVar2;
  double dVar3;
  double dVar4;
  string local_80;
  string local_60;
  string local_40;
  
  pCVar1 = this->volCurve;
  if (pCVar1 == (Curve *)0x0 && this->diameter == 0.0) {
    pNVar2 = (NetworkError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&local_80,(string *)&(this->super_Node).super_Element.name);
    NetworkError::NetworkError(pNVar2,7,&local_80);
    __cxa_throw(pNVar2,&NetworkError::typeinfo,ENerror::~ENerror);
  }
  if (pCVar1 == (Curve *)0x0) {
    dVar3 = this->maxHead;
  }
  else {
    if ((int)((ulong)((long)(pCVar1->xData).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pCVar1->xData).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3) < 2) {
      pNVar2 = (NetworkError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_60,(string *)&(this->super_Node).super_Element.name);
      NetworkError::NetworkError(pNVar2,7,&local_60);
      __cxa_throw(pNVar2,&NetworkError::typeinfo,ENerror::~ENerror);
    }
    dVar3 = Curve::x(pCVar1,0);
    dVar3 = dVar3 / this->ucfLength + (this->super_Node).elev;
    if (dVar3 <= this->minHead) {
      dVar3 = this->minHead;
    }
    this->minHead = dVar3;
    pCVar1 = this->volCurve;
    dVar3 = Curve::x(pCVar1,(int)((ulong)((long)(pCVar1->xData).
                                                super__Vector_base<double,_std::allocator<double>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pCVar1->xData).
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl.super__Vector_impl_data._M_start) >> 3) + -1)
    ;
    dVar3 = dVar3 / this->ucfLength + (this->super_Node).elev;
    if (this->maxHead <= dVar3) {
      dVar3 = this->maxHead;
    }
    this->maxHead = dVar3;
  }
  dVar4 = this->minHead;
  if (dVar4 <= dVar3) {
    if (dVar4 <= this->initHead) {
      dVar4 = this->initHead;
    }
    if (dVar4 <= dVar3) {
      dVar3 = dVar4;
    }
    this->initHead = dVar3;
    return;
  }
  pNVar2 = (NetworkError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_40,(string *)&(this->super_Node).super_Element.name)
  ;
  NetworkError::NetworkError(pNVar2,3,&local_40);
  __cxa_throw(pNVar2,&NetworkError::typeinfo,ENerror::~ENerror);
}

Assistant:

void Tank::validate(Network* nw)
{
    // ... check for enough info to compute volume
    if ( diameter == 0.0 && volCurve == nullptr )
    {
        throw NetworkError(NetworkError::INVALID_VOLUME_CURVE, name);
    }

    // ... check that volume curve (depth v. volume in user units)
    //     covers range of depth limits
    if ( volCurve )
    {
        if ( volCurve->size() < 2 )
        {
            throw NetworkError(NetworkError::INVALID_VOLUME_CURVE, name);
        }
        double tankHead = volCurve->x(0) / ucfLength + elev;
        minHead = max(minHead, tankHead);
        tankHead = volCurve->x(volCurve->size() - 1) / ucfLength + elev;
        maxHead = min(maxHead, tankHead);
     }

    // ... check for consistent depth limits
    if ( maxHead < minHead )
    {
        throw NetworkError(NetworkError::INVALID_TANK_LEVELS, name);
    }
    initHead = max(initHead, minHead);
    initHead = min(initHead, maxHead);
}